

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

int readint(uchar *infile)

{
  uint uVar1;
  long lVar2;
  uchar b [4];
  
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    b[lVar2] = infile[lVar2 + nextchar];
  }
  nextchar = nextchar + 4;
  uVar1 = (uint)b[0];
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    uVar1 = uVar1 << 8 | (uint)b[lVar2];
  }
  return uVar1;
}

Assistant:

static int readint(unsigned char *infile)
{
int a,i;
unsigned char b[4];

	/* Read integer A one byte at a time from infile.
	 *
	 * This is portable from Vax to Sun since it eliminates the
	 * need for byte-swapping.
	 *
         *  This routine is only called to read the first 3 values
	 *  in the compressed file, so it doesn't have to be 
	 *  super-efficient
	 */
	for (i=0; i<4; i++) qread(infile,(char *) &b[i],1);
	a = b[0];
	for (i=1; i<4; i++) a = (a<<8) + b[i];
	return(a);
}